

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_parameter.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,
                mrg_parameter<int,_5,_trng::mrg5> *P)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  ios_base *this;
  int *in_RSI;
  istream *in_RDI;
  int i;
  fmtflags flags;
  mrg_parameter<int,_5,_trng::mrg5> P_new;
  delim_c *in_stack_ffffffffffffffa8;
  istream *d;
  istream *in_stack_ffffffffffffffb0;
  int local_30;
  mrg_parameter<int,_5,_trng::mrg5> local_24;
  int *local_10;
  istream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  mrg_parameter<int,_5,_trng::mrg5>::mrg_parameter(&local_24);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  this = (ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18));
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags(this,_Var2);
  utility::delim('\0');
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
                      in_stack_ffffffffffffffa8);
  for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
    std::istream::operator>>(local_8,local_24.a + local_30);
    if (local_30 + 1 < 5) {
      in_stack_ffffffffffffffb0 = local_8;
      utility::delim('\0');
      utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffa8);
    }
  }
  d = local_8;
  utility::delim('\0');
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
                      (delim_c *)d);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    *(undefined8 *)local_10 = local_24.a._0_8_;
    *(undefined8 *)(local_10 + 2) = local_24.a._8_8_;
    local_10[4] = local_24.a[4];
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return (basic_istream<char,_std::char_traits<char>_> *)local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg_parameter &P) {
      mrg_parameter P_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::delim('(');
      for (int i{0}; i < n; ++i) {
        in >> P_new.a[i];
        if (i + 1 < n)
          in >> utility::delim(' ');
      }
      in >> utility::delim(')');
      if (in)
        P = P_new;
      in.flags(flags);
      return in;
    }